

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

void sdf_tools::exportVectorTypes(module *m)

{
  PyObject *pPVar1;
  handle hVar2;
  class_<sdf_tools::real2> *pcVar3;
  handle hVar4;
  class_<sdf_tools::real3> *pcVar5;
  class_<sdf_tools::int3> *pcVar6;
  long lVar7;
  object *poVar8;
  initializer_list<pybind11::detail::field_descriptor> __l;
  initializer_list<pybind11::detail::field_descriptor> __l_00;
  initializer_list<pybind11::detail::field_descriptor> __l_01;
  cpp_function cf_5;
  cpp_function cf;
  unique_function_record unique_rec;
  handle local_1a0;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_198;
  handle local_190;
  handle local_188;
  handle local_180;
  __uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  local_178;
  undefined1 local_170;
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  local_168;
  module *local_150;
  field_descriptor local_148;
  char *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  object local_d0;
  char *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  object local_90;
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  local_88;
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  local_68;
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  local_48;
  
  local_148.name = "x";
  local_148.offset = 0;
  local_148.size = 4;
  local_148.format._M_dataplus._M_p = (pointer)&local_148.format.field_2;
  local_150 = m;
  std::__cxx11::string::_M_construct((ulong)&local_148.format,'\x01');
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  local_108 = "y";
  local_100 = 4;
  local_f8 = 4;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct((ulong)local_f0,'\x01');
  poVar8 = &local_d0;
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  __l._M_len = 2;
  __l._M_array = &local_148;
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  vector(&local_168,__l,(allocator_type *)&local_178);
  local_48.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pybind11::detail::npy_format_descriptor<sdf_tools::real2,_void>::register_dtype
            ((any_container<pybind11::detail::field_descriptor> *)&local_48);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_48);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_168);
  lVar7 = -0x80;
  do {
    pybind11::object::~object(poVar8);
    pPVar1 = poVar8[-4].super_handle.m_ptr;
    if ((PyObject *)(poVar8 + -2) != pPVar1) {
      operator_delete(pPVar1,((PyObject *)(poVar8 + -2))->ob_refcnt + 1);
    }
    poVar8 = poVar8 + -8;
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0);
  pybind11::class_<sdf_tools::real2>::class_<>
            ((class_<sdf_tools::real2> *)&local_188,(local_150->super_object).super_handle.m_ptr,
             "real2");
  local_148.name = "x";
  local_148.offset = CONCAT71(local_148.offset._1_7_,2);
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x13eee3;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_168.
                         super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,2);
  pybind11::class_<sdf_tools::real2>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg>
            ((class_<sdf_tools::real2> *)&local_188,"__init__",(type *)&local_178,
             (is_new_style_constructor *)&local_198,(arg *)&local_148,(arg *)&local_168);
  hVar2.m_ptr = local_188.m_ptr;
  local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_1a0.m_ptr = (PyObject *)PyObject_GetAttrString(local_188.m_ptr,"__init__");
  if (local_1a0.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_1a0.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  hVar4.m_ptr = local_1a0.m_ptr;
  local_198._M_head_impl = (function_record *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_178);
  *(code **)((long)local_178._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_0,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real2>>(pybind11::class_<sdf_tools::real2>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real2>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_178._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "__init__";
  ((handle *)
  ((long)local_178._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  m_ptr = hVar2.m_ptr;
  ((handle *)
  ((long)local_178._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78))->
  m_ptr = hVar4.m_ptr;
  *(byte *)((long)local_178._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       *(byte *)((long)local_178._M_t.
                       super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                       _M_head_impl + 0x59) | 0x12;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_198,(unique_function_record *)&local_178,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_0,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real2>>(pybind11::class_<sdf_tools::real2>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real2>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_178);
  pybind11::object::~object((object *)&local_1a0);
  pybind11::object::~object((object *)&local_190);
  pybind11::detail::add_class_method((object *)&local_188,"__init__",(cpp_function *)&local_198);
  pybind11::object::~object((object *)&local_198);
  local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_188.m_ptr,"__init__");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_1a0.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_1a0.m_ptr;
  }
  local_1a0.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_1a0.m_ptr;
  local_198._M_head_impl = (function_record *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_178);
  *(code **)((long)local_178._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_1,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real2>>(pybind11::class_<sdf_tools::real2>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real2>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_178._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "__init__";
  ((handle *)
  ((long)local_178._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  m_ptr = local_188.m_ptr;
  ((handle *)
  ((long)local_178._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78))->
  m_ptr = hVar2.m_ptr;
  *(byte *)((long)local_178._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       *(byte *)((long)local_178._M_t.
                       super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                       _M_head_impl + 0x59) | 0x12;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_198,(unique_function_record *)&local_178,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_1,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real2>>(pybind11::class_<sdf_tools::real2>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real2>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_178);
  pybind11::object::~object((object *)&local_1a0);
  pybind11::object::~object((object *)&local_190);
  pybind11::detail::add_class_method((object *)&local_188,"__init__",(cpp_function *)&local_198);
  pybind11::object::~object((object *)&local_198);
  pcVar3 = pybind11::class_<sdf_tools::real2>::def_readwrite<sdf_tools::real2,float>
                     ((class_<sdf_tools::real2> *)&local_188,"x",0);
  pcVar3 = pybind11::class_<sdf_tools::real2>::def_readwrite<sdf_tools::real2,float>(pcVar3,"y",4);
  pPVar1 = (pcVar3->super_generic_type).super_object.super_handle.m_ptr;
  local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__getitem__");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_1a0.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_1a0.m_ptr;
  }
  local_1a0.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_1a0.m_ptr;
  local_198._M_head_impl = (function_record *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_178);
  *(code **)((long)local_178._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_2,float,sdf_tools::real2_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_2&&,float(*)(sdf_tools::real2_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_178._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "__getitem__";
  *(byte *)((long)local_178._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       *(byte *)((long)local_178._M_t.
                       super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                       _M_head_impl + 0x59) | 0x10;
  ((handle *)
  ((long)local_178._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  m_ptr = pPVar1;
  ((handle *)
  ((long)local_178._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78))->
  m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_198,(unique_function_record *)&local_178,"({%}, {int}) -> float"
             ,(type_info **)
              pybind11::cpp_function::
              initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_2,float,sdf_tools::real2_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_2&&,float(*)(sdf_tools::real2_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
              ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_178);
  pybind11::object::~object((object *)&local_1a0);
  pybind11::object::~object((object *)&local_190);
  pybind11::detail::add_class_method((object *)pcVar3,"__getitem__",(cpp_function *)&local_198);
  pybind11::object::~object((object *)&local_198);
  pPVar1 = (pcVar3->super_generic_type).super_object.super_handle.m_ptr;
  local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__str__");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_1a0.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_1a0.m_ptr;
  }
  local_1a0.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_1a0.m_ptr;
  local_198._M_head_impl = (function_record *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_178);
  *(code **)((long)local_178._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_3,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_3&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_178._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "__str__";
  *(byte *)((long)local_178._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       *(byte *)((long)local_178._M_t.
                       super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                       _M_head_impl + 0x59) | 0x10;
  ((handle *)
  ((long)local_178._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  m_ptr = pPVar1;
  ((handle *)
  ((long)local_178._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78))->
  m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_198,(unique_function_record *)&local_178,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_3,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_3&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_3,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_3&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_178);
  pybind11::object::~object((object *)&local_1a0);
  pybind11::object::~object((object *)&local_190);
  pybind11::detail::add_class_method((object *)pcVar3,"__str__",(cpp_function *)&local_198);
  pybind11::object::~object((object *)&local_198);
  pPVar1 = (pcVar3->super_generic_type).super_object.super_handle.m_ptr;
  local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__repr__");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_1a0.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_1a0.m_ptr;
  }
  local_1a0.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_1a0.m_ptr;
  local_198._M_head_impl = (function_record *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_178);
  *(code **)((long)local_178._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_4,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_4&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_178._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "__repr__";
  *(byte *)((long)local_178._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       *(byte *)((long)local_178._M_t.
                       super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                       _M_head_impl + 0x59) | 0x10;
  ((handle *)
  ((long)local_178._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  m_ptr = pPVar1;
  ((handle *)
  ((long)local_178._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78))->
  m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_198,(unique_function_record *)&local_178,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_4,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_4&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_4,pybind11::str,sdf_tools::real2_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_4&&,pybind11::str(*)(sdf_tools::real2_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_178);
  pybind11::object::~object((object *)&local_1a0);
  pybind11::object::~object((object *)&local_190);
  pybind11::detail::add_class_method((object *)pcVar3,"__repr__",(cpp_function *)&local_198);
  pybind11::object::~object((object *)&local_198);
  pybind11::object::~object((object *)&local_188);
  pybind11::implicitly_convertible<pybind11::tuple,sdf_tools::real2>();
  pybind11::implicitly_convertible<pybind11::list,sdf_tools::real2>();
  local_148.name = "x";
  local_148.offset = 0;
  local_148.size = 4;
  local_148.format._M_dataplus._M_p = (pointer)&local_148.format.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_148.format,'\x01');
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  local_108 = "y";
  local_100 = 4;
  local_f8 = 4;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct((ulong)local_f0,'\x01');
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  local_c8 = "z";
  local_c0 = 8;
  local_b8 = 4;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct((ulong)local_b0,'\x01');
  poVar8 = &local_90;
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  __l_00._M_len = 3;
  __l_00._M_array = &local_148;
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  vector(&local_168,__l_00,(allocator_type *)&local_178);
  local_68.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pybind11::detail::npy_format_descriptor<sdf_tools::real3,_void>::register_dtype
            ((any_container<pybind11::detail::field_descriptor> *)&local_68);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_68);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_168);
  lVar7 = -0xc0;
  do {
    pybind11::object::~object(poVar8);
    pPVar1 = poVar8[-4].super_handle.m_ptr;
    if ((PyObject *)(poVar8 + -2) != pPVar1) {
      operator_delete(pPVar1,((PyObject *)(poVar8 + -2))->ob_refcnt + 1);
    }
    poVar8 = poVar8 + -8;
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0);
  pybind11::class_<sdf_tools::real3>::class_<>
            ((class_<sdf_tools::real3> *)&local_180,(local_150->super_object).super_handle.m_ptr,
             "real3");
  local_148.name = "x";
  local_148.offset = CONCAT71(local_148.offset._1_7_,2);
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x13eee3;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_168.
                         super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,2);
  local_178._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )((long)"nz" + 1);
  local_170 = 2;
  pybind11::class_<sdf_tools::real3>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg>
            ((class_<sdf_tools::real3> *)&local_180,"__init__",(type *)&local_198,
             (is_new_style_constructor *)&local_1a0,(arg *)&local_148,(arg *)&local_168,
             (arg *)&local_178);
  hVar2.m_ptr = local_180.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar4.m_ptr = (PyObject *)PyObject_GetAttrString(local_180.m_ptr,"__init__");
  if (hVar4.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar4.m_ptr = local_190.m_ptr;
  }
  local_190.m_ptr = hVar4.m_ptr;
  hVar4.m_ptr = local_190.m_ptr;
  local_1a0.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_198);
  (local_198._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_5,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real3>>(pybind11::class_<sdf_tools::real3>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_198._M_head_impl)->name = "__init__";
  ((local_198._M_head_impl)->scope).m_ptr = hVar2.m_ptr;
  ((local_198._M_head_impl)->sibling).m_ptr = hVar4.m_ptr;
  (local_198._M_head_impl)->field_0x59 = (local_198._M_head_impl)->field_0x59 | 0x12;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_1a0,(unique_function_record *)&local_198,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_5,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real3>>(pybind11::class_<sdf_tools::real3>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_198);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)&local_180,"__init__",(cpp_function *)&local_1a0);
  pybind11::object::~object((object *)&local_1a0);
  hVar2.m_ptr = local_180.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar4.m_ptr = (PyObject *)PyObject_GetAttrString(local_180.m_ptr,"__init__");
  if (hVar4.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar4.m_ptr = local_190.m_ptr;
  }
  local_190.m_ptr = hVar4.m_ptr;
  hVar4.m_ptr = local_190.m_ptr;
  local_1a0.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_198);
  (local_198._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_6,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real3>>(pybind11::class_<sdf_tools::real3>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_198._M_head_impl)->name = "__init__";
  ((local_198._M_head_impl)->scope).m_ptr = hVar2.m_ptr;
  ((local_198._M_head_impl)->sibling).m_ptr = hVar4.m_ptr;
  (local_198._M_head_impl)->field_0x59 = (local_198._M_head_impl)->field_0x59 | 0x12;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_1a0,(unique_function_record *)&local_198,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_6,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::real3>>(pybind11::class_<sdf_tools::real3>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::real3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_198);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)&local_180,"__init__",(cpp_function *)&local_1a0);
  pybind11::object::~object((object *)&local_1a0);
  pcVar5 = pybind11::class_<sdf_tools::real3>::def_readwrite<sdf_tools::real3,float>
                     ((class_<sdf_tools::real3> *)&local_180,"x",0);
  pcVar5 = pybind11::class_<sdf_tools::real3>::def_readwrite<sdf_tools::real3,float>(pcVar5,"y",4);
  pcVar5 = pybind11::class_<sdf_tools::real3>::def_readwrite<sdf_tools::real3,float>(pcVar5,"z",8);
  pPVar1 = (pcVar5->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__getitem__");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_190.m_ptr;
  }
  local_190.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_190.m_ptr;
  local_1a0.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_198);
  (local_198._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_7,float,sdf_tools::real3_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_7&&,float(*)(sdf_tools::real3_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_198._M_head_impl)->name = "__getitem__";
  (local_198._M_head_impl)->field_0x59 = (local_198._M_head_impl)->field_0x59 | 0x10;
  ((local_198._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_198._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_1a0,(unique_function_record *)&local_198,"({%}, {int}) -> float"
             ,(type_info **)
              pybind11::cpp_function::
              initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_7,float,sdf_tools::real3_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_7&&,float(*)(sdf_tools::real3_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
              ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_198);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar5,"__getitem__",(cpp_function *)&local_1a0);
  pybind11::object::~object((object *)&local_1a0);
  pPVar1 = (pcVar5->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__str__");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_190.m_ptr;
  }
  local_190.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_190.m_ptr;
  local_1a0.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_198);
  (local_198._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_8,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_8&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_198._M_head_impl)->name = "__str__";
  (local_198._M_head_impl)->field_0x59 = (local_198._M_head_impl)->field_0x59 | 0x10;
  ((local_198._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_198._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_1a0,(unique_function_record *)&local_198,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_8,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_8&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_8,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_8&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_198);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar5,"__str__",(cpp_function *)&local_1a0);
  pybind11::object::~object((object *)&local_1a0);
  pPVar1 = (pcVar5->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__repr__");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_190.m_ptr;
  }
  local_190.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_190.m_ptr;
  local_1a0.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_198);
  (local_198._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_9,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_9&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_198._M_head_impl)->name = "__repr__";
  (local_198._M_head_impl)->field_0x59 = (local_198._M_head_impl)->field_0x59 | 0x10;
  ((local_198._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_198._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_1a0,(unique_function_record *)&local_198,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_9,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_9&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_9,pybind11::str,sdf_tools::real3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_9&&,pybind11::str(*)(sdf_tools::real3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_198);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar5,"__repr__",(cpp_function *)&local_1a0);
  pybind11::object::~object((object *)&local_1a0);
  pybind11::object::~object((object *)&local_180);
  pybind11::implicitly_convertible<pybind11::tuple,sdf_tools::real3>();
  pybind11::implicitly_convertible<pybind11::list,sdf_tools::real3>();
  local_148.name = "x";
  local_148.offset = 0;
  local_148.size = 4;
  local_148.format._M_dataplus._M_p = (pointer)&local_148.format.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_148.format,'\x01');
  pybind11::detail::npy_format_descriptor<int,_void>::dtype();
  local_108 = "y";
  local_100 = 4;
  local_f8 = 4;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct((ulong)local_f0,'\x01');
  pybind11::detail::npy_format_descriptor<int,_void>::dtype();
  local_c8 = "z";
  local_c0 = 8;
  local_b8 = 4;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct((ulong)local_b0,'\x01');
  poVar8 = &local_90;
  pybind11::detail::npy_format_descriptor<int,_void>::dtype();
  __l_01._M_len = 3;
  __l_01._M_array = &local_148;
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  vector(&local_168,__l_01,(allocator_type *)&local_178);
  local_88.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_168.
       super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pybind11::detail::npy_format_descriptor<sdf_tools::int3,_void>::register_dtype
            ((any_container<pybind11::detail::field_descriptor> *)&local_88);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_88);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(&local_168);
  lVar7 = -0xc0;
  do {
    pybind11::object::~object(poVar8);
    pPVar1 = poVar8[-4].super_handle.m_ptr;
    if ((PyObject *)(poVar8 + -2) != pPVar1) {
      operator_delete(pPVar1,((PyObject *)(poVar8 + -2))->ob_refcnt + 1);
    }
    poVar8 = poVar8 + -8;
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0);
  pybind11::class_<sdf_tools::int3>::class_<>
            ((class_<sdf_tools::int3> *)&local_180,(local_150->super_object).super_handle.m_ptr,
             "int3");
  local_148.name = "x";
  local_148.offset = CONCAT71(local_148.offset._1_7_,2);
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x13eee3;
  local_168.
  super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_168.
                         super__Vector_base<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,2);
  local_178._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )((long)"nz" + 1);
  local_170 = 2;
  pybind11::class_<sdf_tools::int3>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg>
            ((class_<sdf_tools::int3> *)&local_180,"__init__",(type *)&local_198,
             (is_new_style_constructor *)&local_1a0,(arg *)&local_148,(arg *)&local_168,
             (arg *)&local_178);
  hVar2.m_ptr = local_180.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar4.m_ptr = (PyObject *)PyObject_GetAttrString(local_180.m_ptr,"__init__");
  if (hVar4.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar4.m_ptr = local_190.m_ptr;
  }
  local_190.m_ptr = hVar4.m_ptr;
  hVar4.m_ptr = local_190.m_ptr;
  local_1a0.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_198);
  (local_198._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_10,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::int3>>(pybind11::class_<sdf_tools::int3>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::int3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_198._M_head_impl)->name = "__init__";
  ((local_198._M_head_impl)->scope).m_ptr = hVar2.m_ptr;
  ((local_198._M_head_impl)->sibling).m_ptr = hVar4.m_ptr;
  (local_198._M_head_impl)->field_0x59 = (local_198._M_head_impl)->field_0x59 | 0x12;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_1a0,(unique_function_record *)&local_198,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_10,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::tuple),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::int3>>(pybind11::class_<sdf_tools::int3>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::tuple)#1},void,pybind11::detail::value_and_holder&,pybind11::tuple,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::int3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::tuple),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_198);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)&local_180,"__init__",(cpp_function *)&local_1a0);
  pybind11::object::~object((object *)&local_1a0);
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(local_180.m_ptr,"__init__");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_190.m_ptr;
  }
  local_190.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_190.m_ptr;
  local_1a0.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_198);
  (local_198._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_11,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::int3>>(pybind11::class_<sdf_tools::int3>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::int3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_198._M_head_impl)->name = "__init__";
  ((local_198._M_head_impl)->scope).m_ptr = local_180.m_ptr;
  ((local_198._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  (local_198._M_head_impl)->field_0x59 = (local_198._M_head_impl)->field_0x59 | 0x12;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_1a0,(unique_function_record *)&local_198,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::$_11,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::list),pybind11::detail::void_type()>::execute<pybind11::class_<sdf_tools::int3>>(pybind11::class_<sdf_tools::int3>&)&&::{lambda(pybind11::detail::value_and_holder&,pybind11::list)#1},void,pybind11::detail::value_and_holder&,pybind11::list,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<sdf_tools::int3>&&,void(*)(pybind11::detail::value_and_holder&,pybind11::list),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_198);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)&local_180,"__init__",(cpp_function *)&local_1a0);
  pybind11::object::~object((object *)&local_1a0);
  pcVar6 = pybind11::class_<sdf_tools::int3>::def_readwrite<sdf_tools::int3,int>
                     ((class_<sdf_tools::int3> *)&local_180,"x",0);
  pcVar6 = pybind11::class_<sdf_tools::int3>::def_readwrite<sdf_tools::int3,int>(pcVar6,"y",4);
  pcVar6 = pybind11::class_<sdf_tools::int3>::def_readwrite<sdf_tools::int3,int>(pcVar6,"z",8);
  pPVar1 = (pcVar6->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__getitem__");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_190.m_ptr;
  }
  local_190.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_190.m_ptr;
  local_1a0.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_198);
  (local_198._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_12,int,sdf_tools::int3_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_12&&,int(*)(sdf_tools::int3_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_198._M_head_impl)->name = "__getitem__";
  (local_198._M_head_impl)->field_0x59 = (local_198._M_head_impl)->field_0x59 | 0x10;
  ((local_198._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_198._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_1a0,(unique_function_record *)&local_198,"({%}, {int}) -> int",
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_12,int,sdf_tools::int3_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_12&&,int(*)(sdf_tools::int3_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_198);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar6,"__getitem__",(cpp_function *)&local_1a0);
  pybind11::object::~object((object *)&local_1a0);
  pPVar1 = (pcVar6->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__str__");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_190.m_ptr;
  }
  local_190.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_190.m_ptr;
  local_1a0.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_198);
  (local_198._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_13,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_13&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_198._M_head_impl)->name = "__str__";
  (local_198._M_head_impl)->field_0x59 = (local_198._M_head_impl)->field_0x59 | 0x10;
  ((local_198._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_198._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_1a0,(unique_function_record *)&local_198,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_13,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_13&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_13,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_13&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_198);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar6,"__str__",(cpp_function *)&local_1a0);
  pybind11::object::~object((object *)&local_1a0);
  pPVar1 = (pcVar6->super_generic_type).super_object.super_handle.m_ptr;
  local_188.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar2.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__repr__");
  if (hVar2.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_190.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2.m_ptr = local_190.m_ptr;
  }
  local_190.m_ptr = hVar2.m_ptr;
  hVar2.m_ptr = local_190.m_ptr;
  local_1a0.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_198);
  (local_198._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_14,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_14&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_198._M_head_impl)->name = "__repr__";
  (local_198._M_head_impl)->field_0x59 = (local_198._M_head_impl)->field_0x59 | 0x10;
  ((local_198._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_198._M_head_impl)->sibling).m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_1a0,(unique_function_record *)&local_198,
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_14,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_14&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportVectorTypes(pybind11::module_&)::$_14,pybind11::str,sdf_tools::int3_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportVectorTypes(pybind11::module_&)::$_14&&,pybind11::str(*)(sdf_tools::int3_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_198);
  pybind11::object::~object((object *)&local_190);
  pybind11::object::~object((object *)&local_188);
  pybind11::detail::add_class_method((object *)pcVar6,"__repr__",(cpp_function *)&local_1a0);
  pybind11::object::~object((object *)&local_1a0);
  pybind11::object::~object((object *)&local_180);
  pybind11::implicitly_convertible<pybind11::tuple,sdf_tools::int3>();
  pybind11::implicitly_convertible<pybind11::list,sdf_tools::int3>();
  return;
}

Assistant:

void exportVectorTypes(py::module &m)
{
    PYBIND11_NUMPY_DTYPE(real2, x, y);
    py::class_<real2>(m, "real2")
        .def(py::init<real, real>(), "x"_a, "y"_a)
        .def(py::init([](py::tuple t) {
                          if (py::len(t) != 2)
                              throw std::runtime_error("Should have length 2.");
                          return real2{t[0].cast<real>(), t[1].cast<real>()};
                      }))
        .def(py::init([](py::list t) {
                          if (py::len(t) != 2)
                              throw std::runtime_error("Should have length 2.");
                          return real2{t[0].cast<real>(), t[1].cast<real>()};
                      }))
        .def_readwrite("x", &real2::x)
        .def_readwrite("y", &real2::y)
        .def("__getitem__",
             [](const real2 &v, size_t i) {
                 if (i == 0) return v.x;
                 if (i == 1) return v.y;
                 throw py::index_error();
                 return 0._r;
             })
        .def("__str__", [](const real2 &v) { return "({}, {})"_s.format(v.x, v.y); })
        .def("__repr__",
             [](const real2 &v) { return "real2({}, {})"_s.format(v.x, v.y); });

    py::implicitly_convertible<py::tuple, real2>();
    py::implicitly_convertible<py::list, real2>();



    PYBIND11_NUMPY_DTYPE(real3, x, y, z);
    py::class_<real3>(m, "real3")
        .def(py::init<real, real, real>(), "x"_a, "y"_a, "z"_a)
        .def(py::init([](py::tuple t) {
                          if (py::len(t) != 3)
                              throw std::runtime_error("Should have length 3.");
                          return real3{t[0].cast<real>(), t[1].cast<real>(), t[2].cast<real>()};
                      }))
        .def(py::init([](py::list t) {
                          if (py::len(t) != 3)
                              throw std::runtime_error("Should have length 3.");
                          return real3{t[0].cast<real>(), t[1].cast<real>(), t[2].cast<real>()};
                      }))
        .def_readwrite("x", &real3::x)
        .def_readwrite("y", &real3::y)
        .def_readwrite("z", &real3::z)
        .def("__getitem__",
             [](const real3 &v, size_t i) {
                 if (i == 0) return v.x;
                 if (i == 1) return v.y;
                 if (i == 2) return v.z;
                 throw py::index_error();
                 return 0._r;
             })
        .def("__str__", [](const real3 &v) { return "({}, {}, {})"_s.format(v.x, v.y, v.z); })
        .def("__repr__",
             [](const real3 &v) { return "real3({}, {}, {})"_s.format(v.x, v.y, v.z); });

    py::implicitly_convertible<py::tuple, real3>();
    py::implicitly_convertible<py::list, real3>();


    PYBIND11_NUMPY_DTYPE(int3, x, y, z);
    py::class_<int3>(m, "int3")
        .def(py::init<int, int, int>(), "x"_a, "y"_a, "z"_a)
        .def(py::init([](py::tuple t) {
                          if (py::len(t) != 3) throw std::runtime_error("Should have length 3.");
                          return int3{t[0].cast<int>(), t[1].cast<int>(), t[2].cast<int>()};
                      }))
        .def(py::init([](py::list t) {
                          if (py::len(t) != 3) throw std::runtime_error("Should have length 3.");
                          return int3{t[0].cast<int>(), t[1].cast<int>(), t[2].cast<int>()};
                      }))
        .def_readwrite("x", &int3::x)
        .def_readwrite("y", &int3::y)
        .def_readwrite("z", &int3::z)
        .def("__getitem__",
             [](const int3 &v, size_t i) {
                 if (i == 0) return v.x;
                 if (i == 1) return v.y;
                 if (i == 2) return v.z;
                 throw py::index_error();
                 return 0;
             })
        .def("__str__", [](const int3 &v) { return "({}, {}, {})"_s.format(v.x, v.y, v.z); })
        .def("__repr__",
             [](const int3 &v) { return "int3({}, {}, {})"_s.format(v.x, v.y, v.z); });

    py::implicitly_convertible<py::tuple, int3>();
    py::implicitly_convertible<py::list, int3>();
}